

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::RestraintStamp::RestraintStamp(RestraintStamp *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __a;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar1;
  undefined7 in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5bf;
  DataHolder *in_stack_fffffffffffff5c0;
  value_type *in_stack_fffffffffffff5c8;
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffff5d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *in_stack_fffffffffffff5f0;
  char *in_stack_fffffffffffff5f8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_749 [79];
  bool local_6fa;
  allocator<char> local_6f9;
  string local_6f8 [32];
  _Base_ptr local_6d8;
  undefined1 local_6d0;
  undefined8 *local_6c8;
  undefined1 local_6b9 [80];
  allocator<char> local_669;
  string local_668 [32];
  _Base_ptr local_648;
  undefined1 local_640;
  undefined8 *local_638;
  allocator<char> local_629;
  string local_628 [79];
  allocator<char> local_5d9;
  string local_5d8 [32];
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  undefined8 *local_5a8;
  allocator<char> local_599;
  string local_598 [79];
  allocator<char> local_549;
  string local_548 [32];
  _Base_ptr local_528;
  undefined1 local_520;
  undefined8 *local_518;
  allocator<char> local_509;
  string local_508 [79];
  allocator<char> local_4b9;
  string local_4b8 [32];
  _Base_ptr local_498;
  undefined1 local_490;
  undefined8 *local_488;
  allocator<char> local_479;
  string local_478 [79];
  allocator<char> local_429;
  string local_428 [32];
  _Base_ptr local_408;
  undefined1 local_400;
  undefined8 *local_3f8;
  allocator<char> local_3e9;
  string local_3e8 [79];
  allocator<char> local_399;
  string local_398 [32];
  _Base_ptr local_378;
  undefined1 local_370;
  undefined8 *local_368;
  allocator<char> local_359;
  string local_358 [79];
  allocator<char> local_309;
  string local_308 [32];
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  undefined8 *local_2d8;
  allocator<char> local_2c9;
  string local_2c8 [79];
  allocator<char> local_279;
  string local_278 [32];
  _Base_ptr local_258;
  undefined1 local_250;
  undefined8 *local_248;
  allocator<char> local_239;
  string local_238 [79];
  allocator<char> local_1e9;
  string local_1e8 [32];
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  undefined8 *local_1b8;
  allocator<char> local_1a9;
  string local_1a8 [79];
  allocator<char> local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  undefined8 *local_128;
  allocator<char> local_119;
  string local_118 [79];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [79];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder(in_stack_fffffffffffff5c0);
  *in_RDI = &PTR__RestraintStamp_00565340;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff5c0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff5c0);
  Parameter<int>::Parameter((Parameter<int> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff5c0);
  Parameter<bool>::Parameter((Parameter<bool> *)in_stack_fffffffffffff5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_a8 = (_Base_ptr)pVar1.first._M_node;
  local_a0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f1d4);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x21),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_128 = in_RDI + 0x21;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_138 = (_Base_ptr)pVar1.first._M_node;
  local_130 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f350);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x17),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_1b8 = in_RDI + 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_1c8 = (_Base_ptr)pVar1.first._M_node;
  local_1c0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f4cc);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x27),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_248 = in_RDI + 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_258 = (_Base_ptr)pVar1.first._M_node;
  local_250 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f648);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x2e),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_2d8 = in_RDI + 0x2e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_2e8 = (_Base_ptr)pVar1.first._M_node;
  local_2e0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f7c4);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x35),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_368 = in_RDI + 0x35;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_378 = (_Base_ptr)pVar1.first._M_node;
  local_370 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40f940);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3c),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_3f8 = in_RDI + 0x3c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_408 = (_Base_ptr)pVar1.first._M_node;
  local_400 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40fabc);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x43),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_488 = in_RDI + 0x43;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_498 = (_Base_ptr)pVar1.first._M_node;
  local_490 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40fc38);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x4a),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_518 = in_RDI + 0x4a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_528 = (_Base_ptr)pVar1.first._M_node;
  local_520 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40fdb4);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x51),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_5a8 = in_RDI + 0x51;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_5b8 = (_Base_ptr)pVar1.first._M_node;
  local_5b0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x40ff30);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x58),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  local_638 = in_RDI + 0x58;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  local_648 = (_Base_ptr)pVar1.first._M_node;
  local_640 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x410094);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator(&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator(&local_669);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x5f),true);
  __s = (char *)(in_RDI + 1);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffff5f0);
  local_6c8 = in_RDI + 0x5f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff5d0,&in_stack_fffffffffffff5c8->first,
             (ParameterBase **)in_stack_fffffffffffff5c0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  __a = pVar1.first._M_node;
  local_6d0 = pVar1.second;
  local_6d8 = __a._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x4101ec);
  std::__cxx11::string::~string((string *)(local_6b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff5c0,
             (string *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8));
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x66),true);
  local_6fa = true;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0x66),&local_6fa);
  __x = (value_type *)(in_RDI + 1);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)local_749;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&__x->first,(ParameterBase **)in_stack_fffffffffffff5c0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x41036a);
  std::__cxx11::string::~string((string *)(local_749 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_749);
  return;
}

Assistant:

RestraintStamp::RestraintStamp() {
    DefineParameter(Type, "restraintType");

    DefineOptionalParameter(MolIndex, "molIndex");
    DefineOptionalParameter(ObjectSelection, "objectSelection");
    DefineOptionalParameter(DisplacementSpringConstant,
                            "displacementSpringConstant");
    DefineOptionalParameter(AbsoluteSpringConstant, "absoluteSpringConstant");
    DefineOptionalParameter(TwistSpringConstant, "twistSpringConstant");
    DefineOptionalParameter(SwingXSpringConstant, "swingXSpringConstant");
    DefineOptionalParameter(SwingYSpringConstant, "swingYSpringConstant");

    DefineOptionalParameter(AbsolutePositionZ, "absolutePositionZ");
    DefineOptionalParameter(RestrainedTwistAngle, "restrainedTwistAngle");
    DefineOptionalParameter(RestrainedSwingXAngle, "restrainedSwingXAngle");
    DefineOptionalParameter(RestrainedSwingYAngle, "restrainedSwingYAngle");
    DefineOptionalParameterWithDefaultValue(Print, "print", true);
  }